

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osh_adapt.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  string *psVar6;
  ostream *poVar7;
  undefined8 uVar8;
  uint uVar9;
  undefined8 in_RSI;
  Alloc *pAVar10;
  long *unaff_R15;
  Read<double> metric;
  path metric_in;
  path metric_out;
  path mesh_out;
  string metric_in_ext;
  CommPtr comm;
  string metric_out_ext;
  CmdLine cmdline;
  AdaptOpts opts;
  path mesh_in;
  Mesh mesh;
  Library lib;
  Read<double> local_7a8;
  Alloc *local_798;
  void *pvStack_790;
  long local_788 [2];
  Read<double> local_778;
  long local_768 [2];
  long *local_758 [2];
  long local_748 [2];
  long *local_738 [2];
  long local_728 [2];
  long *local_718 [2];
  long local_708 [2];
  undefined1 local_6f4 [20];
  long local_6e0 [2];
  undefined8 local_6d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6c8;
  Alloc *local_6c0 [2];
  long local_6b0 [2];
  undefined8 local_6a0;
  Read<double> local_698;
  Alloc *local_688;
  void *local_680;
  Alloc *local_678;
  void *local_670;
  Alloc *local_668;
  void *local_660;
  Alloc *local_658;
  void *local_650;
  undefined8 local_648;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_640;
  undefined8 local_638;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_630;
  CmdLine local_628 [24];
  vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
  local_610 [40];
  Alloc *local_5e8;
  void *pvStack_5e0;
  Alloc local_5d8;
  undefined7 uStack_5d7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>_>_>
  local_598 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_568 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_538 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_508 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
  local_4d8 [56];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4a0;
  long *local_498 [2];
  long local_488 [2];
  undefined8 local_478;
  long local_468 [121];
  Library local_a0;
  
  local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0.argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.world_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a0.world_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a0.self_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a0.self_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_6a0 = in_RSI;
  local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Omega_h::Library::initialize
            ((char *)&local_a0,(int *)"9.34.13-sha.dc235450+00000010000000001",(char ***)local_6f4);
  Omega_h::Library::world();
  Omega_h::CmdLine::CmdLine(local_628);
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--mesh-in","");
  pAVar10 = &local_5d8;
  local_5e8 = pAVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"input mesh file path","");
  psVar6 = (string *)Omega_h::CmdLine::add_flag((string *)local_628,(string *)&local_478);
  if (local_5e8 != pAVar10) {
    operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"mesh.msh","");
  pvStack_5e0 = (void *)0x0;
  local_5d8 = (Alloc)0x0;
  local_5e8 = pAVar10;
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar6,(string *)&local_478);
  if (local_5e8 != pAVar10) {
    operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--mesh-out","");
  local_5e8 = pAVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"output mesh file path","");
  psVar6 = (string *)Omega_h::CmdLine::add_flag((string *)local_628,(string *)&local_478);
  if (local_5e8 != pAVar10) {
    operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"mesh.msh","");
  pvStack_5e0 = (void *)0x0;
  local_5d8 = (Alloc)0x0;
  local_5e8 = pAVar10;
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar6,(string *)&local_478);
  if (local_5e8 != pAVar10) {
    operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--metric-in","");
  local_5e8 = pAVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"input metric file path","");
  psVar6 = (string *)Omega_h::CmdLine::add_flag((string *)local_628,(string *)&local_478);
  if (local_5e8 != pAVar10) {
    operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"metric.txt","");
  pvStack_5e0 = (void *)0x0;
  local_5d8 = (Alloc)0x0;
  local_5e8 = pAVar10;
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar6,(string *)&local_478);
  if (local_5e8 != pAVar10) {
    operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--metric-out","");
  local_5e8 = pAVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"output metric file path","")
  ;
  psVar6 = (string *)Omega_h::CmdLine::add_flag((string *)local_628,(string *)&local_478);
  if (local_5e8 != pAVar10) {
    operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"metric.txt","");
  pvStack_5e0 = (void *)0x0;
  local_5d8 = (Alloc)0x0;
  local_5e8 = pAVar10;
  Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>(psVar6,(string *)&local_478);
  if (local_5e8 != pAVar10) {
    operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  local_638 = local_6d0;
  local_630 = local_6c8;
  if (local_6c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_6c8 + 8) = *(int *)(local_6c8 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_6c8 + 8) = *(int *)(local_6c8 + 8) + 1;
    }
  }
  cVar4 = Omega_h::CmdLine::parse_final(local_628,&local_638,local_6f4,local_6a0);
  if (local_630 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630);
  }
  iVar5 = -1;
  if (cVar4 != '\0') {
    local_478 = local_468;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--mesh-in","");
    cVar4 = Omega_h::CmdLine::parsed((string *)local_628);
    if (local_478 != local_468) {
      operator_delete(local_478,local_468[0] + 1);
    }
    if (cVar4 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No input mesh file specified\n",0x1d);
    }
    else {
      local_478 = local_468;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--mesh-out","");
      cVar4 = Omega_h::CmdLine::parsed((string *)local_628);
      if (local_478 != local_468) {
        operator_delete(local_478,local_468[0] + 1);
      }
      if (cVar4 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"No output mesh file specified\n",0x1e);
      }
      else {
        local_478 = local_468;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--metric-in","");
        cVar4 = Omega_h::CmdLine::parsed((string *)local_628);
        if (local_478 != local_468) {
          operator_delete(local_478,local_468[0] + 1);
        }
        if (cVar4 != '\0') {
          local_5e8 = pAVar10;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"--mesh-in","");
          local_718[0] = local_708;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"mesh.msh","");
          Omega_h::CmdLine::get<std::__cxx11::string>((string *)&local_478,(string *)local_628);
          Omega_h::filesystem::path::path((path *)local_498,(string *)&local_478);
          if (local_478 != local_468) {
            operator_delete(local_478,local_468[0] + 1);
          }
          if (local_718[0] != local_708) {
            operator_delete(local_718[0],local_708[0] + 1);
          }
          if (local_5e8 != pAVar10) {
            operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
          }
          local_5e8 = pAVar10;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"--mesh-out","");
          local_758[0] = local_748;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"mesh.msh","");
          Omega_h::CmdLine::get<std::__cxx11::string>((string *)&local_478,(string *)local_628);
          Omega_h::filesystem::path::path((path *)local_718,(string *)&local_478);
          if (local_478 != local_468) {
            operator_delete(local_478,local_468[0] + 1);
          }
          if (local_758[0] != local_748) {
            operator_delete(local_758[0],local_748[0] + 1);
          }
          if (local_5e8 != pAVar10) {
            operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
          }
          local_5e8 = pAVar10;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"--metric-in","");
          local_6f4._4_8_ = local_6e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_6f4 + 4),"metric.txt","")
          ;
          Omega_h::CmdLine::get<std::__cxx11::string>((string *)&local_478,(string *)local_628);
          Omega_h::filesystem::path::path((path *)local_758,(string *)&local_478);
          if (local_478 != local_468) {
            operator_delete(local_478,local_468[0] + 1);
          }
          if ((long *)local_6f4._4_8_ != local_6e0) {
            operator_delete((void *)local_6f4._4_8_,local_6e0[0] + 1);
          }
          if (local_5e8 != pAVar10) {
            operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Loading mesh from ",0x12);
          poVar7 = (ostream *)
                   Omega_h::filesystem::operator<<((ostream *)&std::cout,(path *)local_498);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          local_648 = local_6d0;
          local_640 = local_6c8;
          if (local_6c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_6c8 + 8) = *(int *)(local_6c8 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_6c8 + 8) = *(int *)(local_6c8 + 8) + 1;
            }
          }
          Omega_h::gmsh::read(&local_478,local_498,&local_648);
          if (local_640 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640);
          }
          local_7a8.write_.shared_alloc_.alloc = (Alloc *)0x0;
          local_7a8.write_.shared_alloc_.direct_ptr = (void *)0x0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Loading target metric from ",0x1b);
          poVar7 = (ostream *)
                   Omega_h::filesystem::operator<<((ostream *)&std::cout,(path *)local_758);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          uVar3 = local_478._4_4_;
          if (local_478._4_4_ < 4) {
            Omega_h::filesystem::path::extension();
            Omega_h::filesystem::path::string_abi_cxx11_();
            if (local_5e8 != pAVar10) {
              operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
            }
            iVar5 = std::__cxx11::string::compare(local_6f4 + 4);
            if (iVar5 == 0) {
              iVar5 = Omega_h::Mesh::nverts();
              uVar9 = (uVar3 + 1) * uVar3 >> 1;
              Omega_h::read_reals_txt((path *)&local_5e8,(int)local_758,iVar5);
              pAVar2 = local_7a8.write_.shared_alloc_.alloc;
              if (((ulong)local_7a8.write_.shared_alloc_.alloc & 7) == 0 &&
                  local_7a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                pAVar1 = local_7a8.write_.shared_alloc_.alloc + 0x30;
                *(int *)pAVar1 = *(int *)pAVar1 + -1;
                if (*(int *)pAVar1 == 0) {
                  Omega_h::Alloc::~Alloc(local_7a8.write_.shared_alloc_.alloc);
                  operator_delete(pAVar2,0x48);
                }
              }
              local_7a8.write_.shared_alloc_.alloc = local_5e8;
              local_7a8.write_.shared_alloc_.direct_ptr = pvStack_5e0;
              if ((((ulong)local_5e8 & 7) == 0 && local_5e8 != (Alloc *)0x0) &&
                 ((char)Omega_h::entering_parallel == '\x01')) {
                *(int *)(local_5e8 + 0x30) = *(int *)(local_5e8 + 0x30) + -1;
                local_7a8.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_5e8 * 8 + 1);
              }
              local_658 = local_7a8.write_.shared_alloc_.alloc;
              if (((ulong)local_7a8.write_.shared_alloc_.alloc & 7) == 0 &&
                  local_7a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                if ((char)Omega_h::entering_parallel == '\x01') {
                  local_658 = (Alloc *)(*(long *)local_7a8.write_.shared_alloc_.alloc * 8 + 1);
                }
                else {
                  *(int *)(local_7a8.write_.shared_alloc_.alloc + 0x30) =
                       *(int *)(local_7a8.write_.shared_alloc_.alloc + 0x30) + 1;
                }
              }
              local_650 = pvStack_5e0;
              Omega_h::symms_inria2osh(&local_5e8,uVar3);
              pAVar2 = local_7a8.write_.shared_alloc_.alloc;
              if (((ulong)local_7a8.write_.shared_alloc_.alloc & 7) == 0 &&
                  local_7a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                pAVar1 = local_7a8.write_.shared_alloc_.alloc + 0x30;
                *(int *)pAVar1 = *(int *)pAVar1 + -1;
                if (*(int *)pAVar1 == 0) {
                  Omega_h::Alloc::~Alloc(local_7a8.write_.shared_alloc_.alloc);
                  operator_delete(pAVar2,0x48);
                }
              }
              pAVar2 = local_658;
              local_7a8.write_.shared_alloc_.alloc = local_5e8;
              local_7a8.write_.shared_alloc_.direct_ptr = pvStack_5e0;
              if ((((ulong)local_5e8 & 7) == 0 && local_5e8 != (Alloc *)0x0) &&
                 ((char)Omega_h::entering_parallel == '\x01')) {
                *(int *)(local_5e8 + 0x30) = *(int *)(local_5e8 + 0x30) + -1;
                local_7a8.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_5e8 * 8 + 1);
              }
              local_5e8 = (Alloc *)0x0;
              pvStack_5e0 = (void *)0x0;
              if (((ulong)local_658 & 7) == 0 && local_658 != (Alloc *)0x0) {
                pAVar1 = local_658 + 0x30;
                *(int *)pAVar1 = *(int *)pAVar1 + -1;
                if (*(int *)pAVar1 == 0) {
                  Omega_h::Alloc::~Alloc(local_658);
                  operator_delete(pAVar2,0x48);
                }
              }
              local_5e8 = pAVar10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_5e8,"target_metric","");
              local_668 = local_7a8.write_.shared_alloc_.alloc;
              if (((ulong)local_7a8.write_.shared_alloc_.alloc & 7) == 0 &&
                  local_7a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                if ((char)Omega_h::entering_parallel == '\x01') {
                  local_668 = (Alloc *)(*(long *)local_7a8.write_.shared_alloc_.alloc * 8 + 1);
                }
                else {
                  *(int *)(local_7a8.write_.shared_alloc_.alloc + 0x30) =
                       *(int *)(local_7a8.write_.shared_alloc_.alloc + 0x30) + 1;
                }
              }
              local_660 = local_7a8.write_.shared_alloc_.direct_ptr;
              Omega_h::Mesh::add_tag<double>(&local_478,0,&local_5e8,uVar9,&local_668,0);
              pAVar2 = local_668;
              if (((ulong)local_668 & 7) == 0 && local_668 != (Alloc *)0x0) {
                pAVar1 = local_668 + 0x30;
                *(int *)pAVar1 = *(int *)pAVar1 + -1;
                if (*(int *)pAVar1 == 0) {
                  Omega_h::Alloc::~Alloc(local_668);
                  operator_delete(pAVar2,0x48);
                }
              }
              if (local_5e8 != pAVar10) {
                operator_delete(local_5e8,CONCAT71(uStack_5d7,local_5d8) + 1);
              }
              Omega_h::AdaptOpts::AdaptOpts((AdaptOpts *)&local_5e8,(Mesh *)&local_478);
              local_678 = local_7a8.write_.shared_alloc_.alloc;
              if (((ulong)local_7a8.write_.shared_alloc_.alloc & 7) == 0 &&
                  local_7a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                if ((char)Omega_h::entering_parallel == '\x01') {
                  local_678 = (Alloc *)(*(long *)local_7a8.write_.shared_alloc_.alloc * 8 + 1);
                }
                else {
                  *(int *)(local_7a8.write_.shared_alloc_.alloc + 0x30) =
                       *(int *)(local_7a8.write_.shared_alloc_.alloc + 0x30) + 1;
                }
              }
              local_670 = local_7a8.write_.shared_alloc_.direct_ptr;
              Omega_h::grade_fix_adapt(&local_478,&local_5e8,&local_678,1);
              pAVar10 = local_678;
              if (((ulong)local_678 & 7) == 0 && local_678 != (Alloc *)0x0) {
                pAVar2 = local_678 + 0x30;
                *(int *)pAVar2 = *(int *)pAVar2 + -1;
                if (*(int *)pAVar2 == 0) {
                  Omega_h::Alloc::~Alloc(local_678);
                  operator_delete(pAVar10,0x48);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Storing mesh in ",0x10);
              poVar7 = (ostream *)
                       Omega_h::filesystem::operator<<((ostream *)&std::cout,(path *)local_718);
              local_738[0] = (long *)CONCAT71(local_738[0]._1_7_,10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_738,1);
              Omega_h::gmsh::write((path *)local_718,(Mesh *)&local_478);
              unaff_R15 = local_728;
              local_738[0] = unaff_R15;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_738,"--metric-out","")
              ;
              cVar4 = Omega_h::CmdLine::parsed((string *)local_628);
              if (local_738[0] != unaff_R15) {
                operator_delete(local_738[0],local_728[0] + 1);
              }
              if (cVar4 != '\0') {
                local_798 = (Alloc *)local_788;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_798,"--metric-out","");
                local_778.write_.shared_alloc_.alloc = (Alloc *)local_768;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_778,"metric.txt","");
                Omega_h::CmdLine::get<std::__cxx11::string>((string *)local_6c0,(string *)local_628)
                ;
                Omega_h::filesystem::path::path((path *)local_738,(string *)local_6c0);
                pAVar10 = (Alloc *)local_6b0;
                if (local_6c0[0] != pAVar10) {
                  operator_delete(local_6c0[0],local_6b0[0] + 1);
                }
                if (local_778.write_.shared_alloc_.alloc != (Alloc *)local_768) {
                  operator_delete(local_778.write_.shared_alloc_.alloc,local_768[0] + 1);
                }
                if (local_798 != (Alloc *)local_788) {
                  operator_delete(local_798,local_788[0] + 1);
                }
                Omega_h::filesystem::path::extension();
                Omega_h::filesystem::path::string_abi_cxx11_();
                if (local_798 != (Alloc *)local_788) {
                  operator_delete(local_798,local_788[0] + 1);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Storing metric in ",0x12);
                poVar7 = (ostream *)
                         Omega_h::filesystem::operator<<((ostream *)&std::cout,(path *)local_738);
                local_798 = (Alloc *)CONCAT71(local_798._1_7_,10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_798,1);
                iVar5 = std::__cxx11::string::compare((char *)local_6c0);
                if (iVar5 != 0) goto LAB_001047d8;
                local_798 = (Alloc *)local_788;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"metric","");
                Omega_h::Mesh::get_array<double>((int)&local_778,(string *)&local_478);
                if (local_798 != (Alloc *)local_788) {
                  operator_delete(local_798,local_788[0] + 1);
                }
                local_688 = local_778.write_.shared_alloc_.alloc;
                if (((ulong)local_778.write_.shared_alloc_.alloc & 7) == 0 &&
                    local_778.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                  if ((char)Omega_h::entering_parallel == '\x01') {
                    local_688 = (Alloc *)(*(long *)local_778.write_.shared_alloc_.alloc * 8 + 1);
                  }
                  else {
                    *(int *)(local_778.write_.shared_alloc_.alloc + 0x30) =
                         *(int *)(local_778.write_.shared_alloc_.alloc + 0x30) + 1;
                  }
                }
                local_680 = local_778.write_.shared_alloc_.direct_ptr;
                Omega_h::symms_osh2inria(&local_798,uVar3);
                pAVar2 = local_778.write_.shared_alloc_.alloc;
                if (((ulong)local_778.write_.shared_alloc_.alloc & 7) == 0 &&
                    local_778.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                  pAVar1 = local_778.write_.shared_alloc_.alloc + 0x30;
                  *(int *)pAVar1 = *(int *)pAVar1 + -1;
                  if (*(int *)pAVar1 == 0) {
                    Omega_h::Alloc::~Alloc(local_778.write_.shared_alloc_.alloc);
                    operator_delete(pAVar2,0x48);
                  }
                }
                local_778.write_.shared_alloc_.alloc = local_798;
                local_778.write_.shared_alloc_.direct_ptr = pvStack_790;
                if ((((ulong)local_798 & 7) == 0 && local_798 != (Alloc *)0x0) &&
                   ((char)Omega_h::entering_parallel == '\x01')) {
                  *(int *)(local_798 + 0x30) = *(int *)(local_798 + 0x30) + -1;
                  local_778.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_798 * 8 + 1);
                }
                pAVar2 = local_688;
                local_798 = (Alloc *)0x0;
                pvStack_790 = (void *)0x0;
                if (((ulong)local_688 & 7) == 0 && local_688 != (Alloc *)0x0) {
                  pAVar1 = local_688 + 0x30;
                  *(int *)pAVar1 = *(int *)pAVar1 + -1;
                  if (*(int *)pAVar1 == 0) {
                    Omega_h::Alloc::~Alloc(pAVar2);
                    operator_delete(pAVar2,0x48);
                  }
                }
                local_698.write_.shared_alloc_.alloc = local_778.write_.shared_alloc_.alloc;
                if (((ulong)local_778.write_.shared_alloc_.alloc & 7) == 0 &&
                    local_778.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                  if ((char)Omega_h::entering_parallel == '\x01') {
                    local_698.write_.shared_alloc_.alloc =
                         (Alloc *)(*(long *)local_778.write_.shared_alloc_.alloc * 8 + 1);
                  }
                  else {
                    *(int *)(local_778.write_.shared_alloc_.alloc + 0x30) =
                         *(int *)(local_778.write_.shared_alloc_.alloc + 0x30) + 1;
                  }
                }
                local_698.write_.shared_alloc_.direct_ptr =
                     local_778.write_.shared_alloc_.direct_ptr;
                Omega_h::write_reals_txt(local_738,&local_698,uVar9);
                pAVar2 = local_698.write_.shared_alloc_.alloc;
                if (((ulong)local_698.write_.shared_alloc_.alloc & 7) == 0 &&
                    local_698.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                  pAVar1 = local_698.write_.shared_alloc_.alloc + 0x30;
                  *(int *)pAVar1 = *(int *)pAVar1 + -1;
                  if (*(int *)pAVar1 == 0) {
                    Omega_h::Alloc::~Alloc(pAVar2);
                    operator_delete(pAVar2,0x48);
                  }
                }
                pAVar2 = local_778.write_.shared_alloc_.alloc;
                if (((ulong)local_778.write_.shared_alloc_.alloc & 7) == 0 &&
                    local_778.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                  pAVar1 = local_778.write_.shared_alloc_.alloc + 0x30;
                  *(int *)pAVar1 = *(int *)pAVar1 + -1;
                  if (*(int *)pAVar1 == 0) {
                    Omega_h::Alloc::~Alloc(local_778.write_.shared_alloc_.alloc);
                    operator_delete(pAVar2,0x48);
                  }
                }
                if (local_6c0[0] != pAVar10) {
                  operator_delete(local_6c0[0],local_6b0[0] + 1);
                }
                if (local_738[0] != unaff_R15) {
                  operator_delete(local_738[0],local_728[0] + 1);
                }
              }
              if (local_4a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a0);
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
              ::~_Rb_tree(local_4d8);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(local_508);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(local_538);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(local_568);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>_>_>
              ::~_Rb_tree(local_598);
              if ((long *)local_6f4._4_8_ != local_6e0) {
                operator_delete((void *)local_6f4._4_8_,local_6e0[0] + 1);
              }
              pAVar10 = local_7a8.write_.shared_alloc_.alloc;
              if (((ulong)local_7a8.write_.shared_alloc_.alloc & 7) == 0 &&
                  local_7a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
                pAVar2 = local_7a8.write_.shared_alloc_.alloc + 0x30;
                *(int *)pAVar2 = *(int *)pAVar2 + -1;
                if (*(int *)pAVar2 == 0) {
                  Omega_h::Alloc::~Alloc(local_7a8.write_.shared_alloc_.alloc);
                  operator_delete(pAVar10,0x48);
                }
              }
              Omega_h::Mesh::~Mesh((Mesh *)&local_478);
              if (local_758[0] != local_748) {
                operator_delete(local_758[0],local_748[0] + 1);
              }
              if (local_718[0] != local_708) {
                operator_delete(local_718[0],local_708[0] + 1);
              }
              if (local_498[0] != local_488) {
                operator_delete(local_498[0],local_488[0] + 1);
              }
              iVar5 = 0;
              goto LAB_00103dae;
            }
          }
          else {
            Omega_h::fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
                          ,0x33);
          }
          uVar8 = Omega_h::filesystem::path::c_str();
          Omega_h::fail("unknown extension for \"%s\"\n",uVar8);
LAB_001047d8:
          uVar8 = Omega_h::filesystem::path::c_str();
          uVar8 = Omega_h::fail("unknown extension for \"%s\"\n",uVar8);
          Omega_h::Read<double>::~Read(&local_698);
          Omega_h::Read<double>::~Read(&local_778);
          if (local_6c0[0] != pAVar10) {
            operator_delete(local_6c0[0],local_6b0[0] + 1);
          }
          if (local_738[0] != unaff_R15) {
            operator_delete(local_738[0],local_728[0] + 1);
          }
          Omega_h::AdaptOpts::~AdaptOpts((AdaptOpts *)&local_5e8);
          if ((long *)local_6f4._4_8_ != local_6e0) {
            operator_delete((void *)local_6f4._4_8_,local_6e0[0] + 1);
          }
          Omega_h::Read<double>::~Read(&local_7a8);
          Omega_h::Mesh::~Mesh((Mesh *)&local_478);
          if (local_758[0] != local_748) {
            operator_delete(local_758[0],local_748[0] + 1);
          }
          if (local_718[0] != local_708) {
            operator_delete(local_718[0],local_708[0] + 1);
          }
          if (local_498[0] != local_488) {
            operator_delete(local_498[0],local_488[0] + 1);
          }
          std::
          vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
          ::~vector(local_610);
          std::
          vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
          ::~vector((vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
                     *)local_628);
          if (local_6c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6c8);
          }
          Omega_h::Library::~Library(&local_a0);
          _Unwind_Resume(uVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"No input metric file specified\n",0x1f);
      }
    }
    Omega_h::CmdLine::show_help((char **)local_628);
  }
LAB_00103dae:
  std::
  vector<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineFlag,_std::default_delete<Omega_h::CmdLineFlag>_>_>_>
  ::~vector(local_610);
  std::
  vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
  ::~vector((vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
             *)local_628);
  if (local_6c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6c8);
  }
  Omega_h::Library::~Library(&local_a0);
  return iVar5;
}

Assistant:

int main(int argc, char** argv) {
  auto lib = Omega_h::Library(&argc, &argv);
  auto comm = lib.world();
  Omega_h::CmdLine cmdline;
#ifdef OMEGA_H_USE_LIBMESHB
  auto metric_doc = "metric.{txt,sol}";
#else
  auto metric_doc = "metric.txt";
#endif
  auto& mesh_in_flag = cmdline.add_flag("--mesh-in", "input mesh file path");
  mesh_in_flag.add_arg<std::string>("mesh.msh");
  auto& mesh_out_flag = cmdline.add_flag("--mesh-out", "output mesh file path");
  mesh_out_flag.add_arg<std::string>("mesh.msh");
  auto& metric_in_flag =
      cmdline.add_flag("--metric-in", "input metric file path");
  metric_in_flag.add_arg<std::string>(metric_doc);
  auto& metric_out_flag =
      cmdline.add_flag("--metric-out", "output metric file path");
  metric_out_flag.add_arg<std::string>(metric_doc);
  if (!cmdline.parse_final(comm, &argc, argv)) {
    return -1;
  }
  if (!cmdline.parsed("--mesh-in")) {
    std::cout << "No input mesh file specified\n";
    cmdline.show_help(argv);
    return -1;
  }
  if (!cmdline.parsed("--mesh-out")) {
    std::cout << "No output mesh file specified\n";
    cmdline.show_help(argv);
    return -1;
  }
  if (!cmdline.parsed("--metric-in")) {
    std::cout << "No input metric file specified\n";
    cmdline.show_help(argv);
    return -1;
  }
  Omega_h::filesystem::path mesh_in =
      cmdline.get<std::string>("--mesh-in", "mesh.msh");
  Omega_h::filesystem::path mesh_out =
      cmdline.get<std::string>("--mesh-out", "mesh.msh");
  Omega_h::filesystem::path metric_in =
      cmdline.get<std::string>("--metric-in", metric_doc);
  std::cout << "Loading mesh from " << mesh_in << "\n";
  auto mesh = Omega_h::gmsh::read(mesh_in, comm);
  Omega_h::Reals target_metric;
  std::cout << "Loading target metric from " << metric_in << "\n";
  auto const dim = mesh.dim();
  auto const metric_in_ext = metric_in.extension().string();
  if (metric_in_ext == ".txt") {
    target_metric = Omega_h::read_reals_txt(
        metric_in, mesh.nverts(), Omega_h::symm_ncomps(dim));
    target_metric = Omega_h::symms_inria2osh(dim, target_metric);
    mesh.add_tag(0, "target_metric", Omega_h::symm_ncomps(dim), target_metric);
  } else
#ifdef OMEGA_H_USE_LIBMESHB
      if (metric_in_ext == ".sol" || metric_in_ext == ".solb") {
    Omega_h::meshb::read_sol(&mesh, metric_in.c_str(), "target_metric");
    target_metric = mesh.get_array<Omega_h::Real>(0, "target_metric");
  } else
#endif
  {
    Omega_h_fail("unknown extension for \"%s\"\n", metric_in.c_str());
  }
  auto opts = Omega_h::AdaptOpts(&mesh);
  Omega_h::grade_fix_adapt(&mesh, opts, target_metric, /*verbose=*/true);
  std::cout << "Storing mesh in " << mesh_out << '\n';
  Omega_h::gmsh::write(mesh_out, &mesh);
  if (cmdline.parsed("--metric-out")) {
    Omega_h::filesystem::path metric_out =
        cmdline.get<std::string>("--metric-out", metric_doc);
    auto const metric_out_ext = metric_out.extension().string();
    std::cout << "Storing metric in " << metric_out << '\n';
    if (metric_out_ext == ".txt") {
      auto metric = mesh.get_array<Omega_h::Real>(0, "metric");
      metric = Omega_h::symms_osh2inria(dim, metric);
      Omega_h::write_reals_txt(metric_out, metric, Omega_h::symm_ncomps(dim));
    } else
#ifdef OMEGA_H_USE_LIBMESHB
        if (metric_out_ext == ".sol" || metric_out_ext == ".solb") {
      Omega_h::meshb::write_sol(&mesh, metric_out.c_str(), "metric");
    } else
#endif
    {
      Omega_h_fail("unknown extension for \"%s\"\n", metric_out.c_str());
    }
  }
}